

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O0

bool FastPForLib::Simple16<true>::tryme<2u,14u>(uint32_t *n,size_t len)

{
  uint local_24;
  uint32_t i;
  uint32_t min;
  size_t len_local;
  uint32_t *n_local;
  
  if (len < 2) {
    local_24 = (uint)len;
  }
  else {
    local_24 = 2;
  }
  i = 0;
  while( true ) {
    if (local_24 <= i) {
      return true;
    }
    if (0x3fff < n[i]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    return true;
  }